

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O2

void Aig_ObjCutPrint(Aig_ManCut_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Cut_t *pCut;
  
  printf("Cuts for node %d:\n",(ulong)(uint)pObj->Id);
  pCut = p->pCuts[pObj->Id];
  for (iVar1 = 0; iVar1 < p->nCutsMax; iVar1 = iVar1 + 1) {
    if (pCut->nFanins != '\0') {
      Aig_CutPrint(pCut);
    }
    pCut = (Aig_Cut_t *)((long)&pCut->pNext + (long)pCut->nCutSize);
  }
  return;
}

Assistant:

void Aig_ObjCutPrint( Aig_ManCut_t * p, Aig_Obj_t * pObj )
{
    Aig_Cut_t * pCut;
    int i;
    printf( "Cuts for node %d:\n", pObj->Id );
    Aig_ObjForEachCut( p, pObj, pCut, i )
        if ( pCut->nFanins )
            Aig_CutPrint( pCut );
//    printf( "\n" );
}